

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::request_workaround_wrapper_overload
          (CompilerGLSL *this,TypeID id)

{
  TypedID<(diligent_spirv_cross::Types)1> *pTVar1;
  TypedID<(diligent_spirv_cross::Types)1> *pTVar2;
  CompilerGLSL *this_local;
  TypeID id_local;
  
  this_local._4_4_ = id.id;
  pTVar1 = ::std::
           begin<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,8ul>>
                     (&this->workaround_ubo_load_overload_types);
  pTVar2 = ::std::
           end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,8ul>>
                     (&this->workaround_ubo_load_overload_types);
  pTVar1 = ::std::
           find<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>*,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>>
                     (pTVar1,pTVar2,
                      (TypedID<(diligent_spirv_cross::Types)1> *)((long)&this_local + 4));
  pTVar2 = ::std::
           end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,8ul>>
                     (&this->workaround_ubo_load_overload_types);
  if (pTVar1 == pTVar2) {
    Compiler::force_recompile(&this->super_Compiler);
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_8UL>::push_back
              (&this->workaround_ubo_load_overload_types,
               (TypedID<(diligent_spirv_cross::Types)1> *)((long)&this_local + 4));
  }
  return;
}

Assistant:

void CompilerGLSL::request_workaround_wrapper_overload(TypeID id)
{
	// Must be ordered to maintain deterministic output, so vector is appropriate.
	if (find(begin(workaround_ubo_load_overload_types), end(workaround_ubo_load_overload_types), id) ==
	    end(workaround_ubo_load_overload_types))
	{
		force_recompile();
		workaround_ubo_load_overload_types.push_back(id);
	}
}